

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O2

GLuint ShaderDb::link_shader_files(vector<unsigned_int,_std::allocator<unsigned_int>_> *p_shaders)

{
  GLuint *pGVar1;
  GLuint p_shader;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  GLuint *pGVar2;
  
  p_shader = (*glad_glCreateProgram)();
  pGVar1 = (p_shaders->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pGVar2 = (p_shaders->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_start; pGVar2 != pGVar1; pGVar2 = pGVar2 + 1) {
    (*glad_glAttachShader)(p_shader,*pGVar2);
  }
  (*glad_glLinkProgram)(p_shader);
  test_shader_program_compilation(p_shader,p_shaders);
  add_shader_program(p_shader,p_shaders);
  return p_shader;
}

Assistant:

GLuint ShaderDb::link_shader_files(
    const std::vector<GLuint> &p_shaders) noexcept
{
    GLuint prg_id = glCreateProgram();
    for (const auto shader_id : p_shaders)
    {
        glAttachShader(prg_id, shader_id);
    }
    glLinkProgram(prg_id);
    test_shader_program_compilation(prg_id, p_shaders);
    add_shader_program(prg_id, p_shaders);
    return prg_id;
}